

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O3

void ncnn::convdw3x3s1_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_requant,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pfVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  void *pvVar13;
  void *pvVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  void *local_78;
  
  iVar3 = top_blob->c;
  if (0 < (long)iVar3) {
    iVar4 = top_blob->w;
    iVar5 = top_blob->h;
    iVar6 = bottom_blob->w;
    lVar11 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        fVar18 = 0.0;
      }
      else {
        fVar18 = *(float *)((long)&_bias->data + lVar11 * 4);
      }
      if (0 < iVar5) {
        local_78 = (void *)(top_blob->cstep * lVar11 * top_blob->elemsize + (long)top_blob->data);
        pfVar7 = (scales_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        fVar1 = pfVar7[lVar11 * 2];
        fVar2 = pfVar7[lVar11 * 2 + 1];
        pvVar13 = (void *)(bottom_blob->cstep * lVar11 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        lVar8 = lVar11 * 9;
        pvVar14 = (void *)((long)pvVar13 + (long)iVar6 * 2);
        lVar15 = (long)pvVar13 + (long)iVar6;
        iVar10 = 0;
        do {
          if (0 < iVar4) {
            lVar17 = 2;
            lVar16 = 0;
            uVar12 = iVar4 + 1;
            do {
              fVar19 = roundf(((float)((int)*(char *)((long)&_kernel->refcount + lVar8) *
                                       (int)*(char *)((long)pvVar14 + lVar17) +
                                       (int)*(char *)((long)&_kernel->data + lVar8 + 7) *
                                       (int)*(char *)((long)pvVar14 + lVar17 + -1) +
                                      (int)*(char *)((long)&_kernel->data + lVar8 + 6) *
                                      (int)*(char *)((long)pvVar14 + lVar17 + -2) +
                                      (int)*(char *)((long)&_kernel->data + lVar8 + 5) *
                                      (int)*(char *)(lVar15 + lVar17) +
                                      (int)*(char *)((long)&_kernel->data + lVar8 + 4) *
                                      (int)*(char *)(lVar15 + -1 + lVar17) +
                                      (int)*(char *)((long)&_kernel->data + lVar8 + 3) *
                                      (int)*(char *)(lVar15 + -2 + lVar17) +
                                      (int)*(char *)((long)&_kernel->data + lVar8 + 2) *
                                      (int)*(char *)((long)pvVar13 + lVar17) +
                                      (int)*(char *)((long)&_kernel->data + lVar8 + 1) *
                                      (int)*(char *)((long)pvVar13 + lVar17 + -1) +
                                      (int)*(char *)((long)&_kernel->data + lVar8) *
                                      (int)*(char *)((long)pvVar13 + lVar17 + -2)) * fVar1 + fVar18)
                              * fVar2);
              iVar9 = (int)fVar19;
              if (iVar9 < -0x7e) {
                iVar9 = -0x7f;
              }
              if (0x7e < iVar9) {
                iVar9 = 0x7f;
              }
              *(char *)((long)local_78 + lVar17 + -2) = (char)iVar9;
              uVar12 = uVar12 - 1;
              lVar16 = lVar16 + -1;
              lVar17 = lVar17 + 1;
            } while (1 < uVar12);
            pvVar14 = (void *)((long)pvVar14 - lVar16);
            lVar15 = lVar15 - lVar16;
            pvVar13 = (void *)((long)pvVar13 - lVar16);
            local_78 = (void *)((long)local_78 - lVar16);
          }
          pvVar13 = (void *)((long)pvVar13 + 2);
          lVar15 = lVar15 + 2;
          pvVar14 = (void *)((long)pvVar14 + 2);
          iVar10 = iVar10 + 1;
        } while (iVar10 != iVar5);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar3);
  }
  return;
}

Assistant:

static void convdw3x3s1_int8_requant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat &_bias, std::vector<float> scales_requant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        signed char *outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_requant_in = scales_requant[2*p];      
        const float scale_requant_out = scales_requant[2*p+1];     

        const signed char *kernel0 = (const signed char *)kernel + p * 9;

        const signed char *img0 = bottom_blob.channel(p);
        const signed char *r0 = img0;
        const signed char *r1 = img0 + w;
        const signed char *r2 = img0 + w * 2;

        int i = 0;
        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr = float2int8(((float)sum * scale_requant_in + bias0) * scale_requant_out);

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}